

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void curse(obj *otmp)

{
  boolean bVar1;
  uint uVar2;
  obj *otmp_local;
  
  if (otmp->oclass != '\f') {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffffd;
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffffe | 1;
    if ((otmp == uwep) &&
       (((uwep->oclass == '\x02' || (uwep->oclass == '\x06')) &&
        ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0)))) {
      reset_remarm();
    }
    if ((otmp == uswapwep) && (u.twoweap != '\0')) {
      drop_uswapwep();
    }
    if ((otmp->where == '\x03') && (bVar1 = confers_luck(otmp), bVar1 != '\0')) {
      set_moreluck();
    }
    else if (otmp->otyp == 0xe0) {
      uVar2 = weight(otmp);
      otmp->owt = uVar2;
    }
    else if ((((otmp->otyp == 0xf6) && (otmp->corpsenm != -1)) &&
             (bVar1 = dead_species(otmp->corpsenm,'\x01'), bVar1 == '\0')) &&
            ((otmp->where == '\x03' || (otmp->where == '\x04')))) {
      attach_fig_transform_timeout(otmp);
    }
  }
  return;
}

Assistant:

void curse(struct obj *otmp)
{
	if (otmp->oclass == COIN_CLASS) return;
	otmp->blessed = 0;
	otmp->cursed = 1;
	/* welded two-handed weapon interferes with some armor removal */
	if (otmp == uwep && bimanual(uwep)) reset_remarm();
	/* rules at top of wield.c state that twoweapon cannot be done
	   with cursed alternate weapon */
	if (otmp == uswapwep && u.twoweap)
	    drop_uswapwep();
	/* some cursed items need immediate updating */
	if (carried(otmp) && confers_luck(otmp))
	    set_moreluck();
	else if (otmp->otyp == BAG_OF_HOLDING)
	    otmp->owt = weight(otmp);
	else if (otmp->otyp == FIGURINE) {
		if (otmp->corpsenm != NON_PM
		    && !dead_species(otmp->corpsenm,TRUE)
		    && (carried(otmp) || mcarried(otmp)))
			attach_fig_transform_timeout(otmp);
	}
	return;
}